

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O1

int arenas_decay_ms_ctl_impl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen,_Bool dirty)

{
  ulong uVar1;
  _Bool _Var2;
  size_t __n;
  ssize_t local_38;
  
  if (mib != (size_t *)0x0 && tsd != (tsd_t *)0x0) {
    if ((char)oldlenp == '\0') {
      local_38 = duckdb_je_arena_muzzy_decay_ms_default_get();
    }
    else {
      local_38 = duckdb_je_arena_dirty_decay_ms_default_get();
    }
    uVar1 = *mib;
    if (uVar1 == 8) {
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled =
           (_Bool)(char)local_38;
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level =
           (char)((ulong)local_38 >> 8);
      tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_min_init_state_nfetched =
           (char)((ulong)local_38 >> 0x10);
      *(int5 *)&tsd->field_0x3 = (int5)((ulong)local_38 >> 0x18);
    }
    else {
      __n = 8;
      if (uVar1 < 8) {
        __n = uVar1;
      }
      switchD_01602a8a::default(tsd,&local_38,__n);
      *mib = __n;
    }
    if (uVar1 != 8) {
      return 0x16;
    }
  }
  if (miblen != 0) {
    if (oldp != (void *)0x8) {
      return 0x16;
    }
    if ((char)oldlenp == '\0') {
      _Var2 = duckdb_je_arena_muzzy_decay_ms_default_set(*(ssize_t *)miblen);
    }
    else {
      _Var2 = duckdb_je_arena_dirty_decay_ms_default_set(*(ssize_t *)miblen);
    }
    if (_Var2 != false) {
      return 0xe;
    }
  }
  return 0;
}

Assistant:

static int
arenas_decay_ms_ctl_impl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp, void *newp,
    size_t newlen, bool dirty) {
	int ret;

	if (oldp != NULL && oldlenp != NULL) {
		size_t oldval = (dirty ? arena_dirty_decay_ms_default_get() :
		    arena_muzzy_decay_ms_default_get());
		READ(oldval, ssize_t);
	}
	if (newp != NULL) {
		if (newlen != sizeof(ssize_t)) {
			ret = EINVAL;
			goto label_return;
		}
		if (dirty ? arena_dirty_decay_ms_default_set(*(ssize_t *)newp)
		    : arena_muzzy_decay_ms_default_set(*(ssize_t *)newp)) {
			ret = EFAULT;
			goto label_return;
		}
	}

	ret = 0;
label_return:
	return ret;
}